

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

basic_value<toml::type_config> * toml::parse<toml::type_config>(istream *is,string *fname,spec s)

{
  bool bVar1;
  syntax_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  source_location in_RSI;
  basic_value<toml::type_config> *in_RDI;
  error_info *err;
  iterator __end0;
  iterator __begin0;
  error_type *__range3;
  string msg;
  result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
  res;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  pointer this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb0;
  string *what_arg;
  basic_value<toml::type_config> *in_stack_fffffffffffffdc8;
  basic_value<toml::type_config> *in_stack_fffffffffffffdd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd8;
  result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
  *this_01;
  string local_1e0 [2];
  reference local_188;
  string *in_stack_fffffffffffffe80;
  __normal_iterator<toml::error_info_*,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
  in_stack_fffffffffffffe88;
  spec in_stack_fffffffffffffea0;
  undefined8 in_stack_ffffffffffffff68;
  
  this_01 = (result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
             *)&stack0x00000008;
  std::__cxx11::string::string(in_RDX,in_stack_fffffffffffffdd8);
  __str = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)this_01;
  this_00 = (this_01->field_1).fail_.value.
            super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>._M_impl.
            super__Vector_impl_data._M_start;
  try_parse<toml::type_config>
            ((istream *)in_stack_fffffffffffffe88._M_current,in_stack_fffffffffffffe80,
             in_stack_fffffffffffffea0);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  bVar1 = result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
          ::is_ok((result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
                   *)&stack0xffffffffffffff18);
  if (!bVar1) {
    std::__cxx11::string::string(in_stack_fffffffffffffdb0);
    result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
    ::unwrap_err(this_01,in_RSI);
    std::vector<toml::error_info,_std::allocator<toml::error_info>_>::begin
              ((vector<toml::error_info,_std::allocator<toml::error_info>_> *)__str);
    std::vector<toml::error_info,_std::allocator<toml::error_info>_>::end
              ((vector<toml::error_info,_std::allocator<toml::error_info>_> *)__str);
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<toml::error_info_*,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
                        ((__normal_iterator<toml::error_info_*,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
                          *)this_00,
                         (__normal_iterator<toml::error_info_*,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
                          *)__str);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      local_188 = __gnu_cxx::
                  __normal_iterator<toml::error_info_*,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
                  ::operator*((__normal_iterator<toml::error_info_*,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
                               *)&stack0xfffffffffffffe88);
      format_error_abi_cxx11_((error_info *)in_stack_ffffffffffffff68);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__str)
      ;
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
      __gnu_cxx::
      __normal_iterator<toml::error_info_*,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
      ::operator++((__normal_iterator<toml::error_info_*,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
                    *)&stack0xfffffffffffffe88);
    }
    this = (syntax_error *)__cxa_allocate_exception(0x40);
    std::__cxx11::string::string(in_RDX,in_stack_fffffffffffffdd8);
    result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
    ::unwrap_err(this_01,in_RSI);
    what_arg = local_1e0;
    std::vector<toml::error_info,_std::allocator<toml::error_info>_>::vector
              ((vector<toml::error_info,_std::allocator<toml::error_info>_> *)this_00,
               (vector<toml::error_info,_std::allocator<toml::error_info>_> *)__str);
    syntax_error::syntax_error
              (this,what_arg,
               (vector<toml::error_info,_std::allocator<toml::error_info>_> *)
               in_stack_fffffffffffffdb0);
    __cxa_throw(this,&syntax_error::typeinfo,syntax_error::~syntax_error);
  }
  result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
  ::unwrap(this_01,in_RSI);
  basic_value<toml::type_config>::basic_value(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
  ::~result((result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
             *)0x71bf30);
  return in_RDI;
}

Assistant:

basic_value<TC> parse(std::istream& is, std::string fname = "unknown file", spec s = spec::default_version())
{
    auto res = try_parse<TC>(is, std::move(fname), std::move(s));
    if(res.is_ok())
    {
        return res.unwrap();
    }
    else
    {
        std::string msg;
        for(const auto& err : res.unwrap_err())
        {
            msg += format_error(err);
        }
        throw syntax_error(std::move(msg), std::move(res.unwrap_err()));
    }
}